

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::MergeReturnPass::HasNontrivialUnreachableBlocks
          (MergeReturnPass *this,Function *function)

{
  pointer puVar1;
  BasicBlock *this_00;
  Instruction *this_01;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  CFG *this_02;
  StructuredCFGAnalysis *this_03;
  pointer puVar5;
  BitVector reachable_blocks;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  utils::BitVector::BitVector(&reachable_blocks,0x400);
  this_02 = Pass::cfg((Pass *)this);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:863:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:863:7)>
             ::_M_manager;
  local_50._M_unused._M_object = &reachable_blocks;
  CFG::ForEachBlockInPostOrder
            (this_02,(BasicBlock *)
                     (((function->blocks_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t,(function<void_(spvtools::opt::BasicBlock_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  puVar1 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (function->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    this_00 = (puVar5->_M_t).
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    uVar3 = BasicBlock::id(this_00);
    bVar2 = utils::BitVector::Get(&reachable_blocks,uVar3);
    if (!bVar2) {
      this_03 = IRContext::GetStructuredCFGAnalysis((this->super_MemPass).super_Pass.context_);
      uVar3 = BasicBlock::id(this_00);
      bVar2 = StructuredCFGAnalysis::IsContinueBlock(this_03,uVar3);
      if (bVar2) {
        this_01 = *(Instruction **)
                   ((long)&(this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
        ;
        if (this_01->opcode_ != OpBranch) break;
        uVar3 = Instruction::GetSingleWordInOperand(this_01,0);
        uVar4 = BasicBlock::id(this_00);
        uVar4 = StructuredCFGAnalysis::ContainingLoop(this_03,uVar4);
        if (uVar3 != uVar4) break;
      }
      else {
        uVar3 = BasicBlock::id(this_00);
        bVar2 = StructuredCFGAnalysis::IsMergeBlock(this_03,uVar3);
        if ((!bVar2) ||
           ((*(Instruction **)
              ((long)&(this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10))->
            opcode_ != OpUnreachable)) break;
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&reachable_blocks);
  return puVar5 != puVar1;
}

Assistant:

bool MergeReturnPass::HasNontrivialUnreachableBlocks(Function* function) {
  utils::BitVector reachable_blocks;
  cfg()->ForEachBlockInPostOrder(
      function->entry().get(),
      [&reachable_blocks](BasicBlock* bb) { reachable_blocks.Set(bb->id()); });

  for (auto& bb : *function) {
    if (reachable_blocks.Get(bb.id())) {
      continue;
    }

    StructuredCFGAnalysis* struct_cfg_analysis =
        context()->GetStructuredCFGAnalysis();
    if (struct_cfg_analysis->IsContinueBlock(bb.id())) {
      // |bb| must be an empty block ending with a branch to the header.
      Instruction* inst = &*bb.begin();
      if (inst->opcode() != spv::Op::OpBranch) {
        return true;
      }

      if (inst->GetSingleWordInOperand(0) !=
          struct_cfg_analysis->ContainingLoop(bb.id())) {
        return true;
      }
    } else if (struct_cfg_analysis->IsMergeBlock(bb.id())) {
      // |bb| must be an empty block ending with OpUnreachable.
      if (bb.begin()->opcode() != spv::Op::OpUnreachable) {
        return true;
      }
    } else {
      return true;
    }
  }
  return false;
}